

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ON_SubDComponentPoint::CompareComponentAndDirection
              (ON_SubDComponentPoint *a,ON_SubDComponentPoint *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (a == b) {
    return 0;
  }
  iVar1 = 1;
  if (a != (ON_SubDComponentPoint *)0x0) {
    if (b != (ON_SubDComponentPoint *)0x0) {
      uVar5 = (a->m_component_ptr).m_ptr;
      uVar2 = (uint)uVar5;
      uVar6 = uVar2 & 6;
      uVar7 = (b->m_component_ptr).m_ptr;
      uVar3 = (uint)uVar7;
      uVar4 = uVar3 & 6;
      if (uVar4 <= uVar6) {
        if (uVar6 <= uVar4) {
          uVar5 = uVar5 & 0xfffffffffffffff8;
          uVar7 = uVar7 & 0xfffffffffffffff8;
          if (uVar5 < uVar7) {
            return -1;
          }
          if (uVar5 <= uVar7) {
            uVar2 = uVar2 & 1;
            uVar3 = uVar3 & 1;
            iVar1 = -1;
            if (uVar3 <= uVar2) {
              return (int)(uVar3 < uVar2);
            }
          }
        }
        return iVar1;
      }
    }
    return -1;
  }
  return 1;
}

Assistant:

int ON_SubDComponentPoint::CompareComponentAndDirection(
  const ON_SubDComponentPoint* a,
  const ON_SubDComponentPoint* b
  )
{
  if ( a == b)
    return 0;  
  if ( nullptr == a)
    return 1; // nullptr > non-null pointer.
  if ( nullptr == b)
    return -1; // nullptr > non-null pointer.

  // 1st: compare component type
  // unset < vertex < edge < face
  ON__UINT_PTR x = (ON_SUBD_COMPONENT_TYPE_MASK & a->m_component_ptr.m_ptr);
  ON__UINT_PTR y = (ON_SUBD_COMPONENT_TYPE_MASK & b->m_component_ptr.m_ptr);
  if ( x < y )
    return -1;
  if ( x > y )
    return 1;

  // 2nd: compare component pointer
  x = (a->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  y = (b->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  if (x < y)
    return -1;
  if (x > y)
    return 1;

  // 3rd: compare component direction flag
  x = (a->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_DIRECTION_MASK);
  y = (b->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_DIRECTION_MASK);
  if (x < y)
    return -1;
  if (x > y)
    return 1;

  return 0;
}